

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O0

void __thiscall foxxll::ufs_file_base::lock(ufs_file_base *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream msg;
  ushort local_40 [4];
  flock lock_struct;
  unique_lock<std::mutex> fd_lock;
  ufs_file_base *this_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&lock_struct.l_pid,&this->fd_mutex_);
  local_40[0] = (ushort)((this->mode_ & 1U) == 0);
  local_40[1] = 0;
  lock_struct.l_type = 0;
  lock_struct.l_whence = 0;
  lock_struct._4_4_ = 0;
  lock_struct.l_start = 0;
  iVar1 = fcntl64(this->file_des_,6,local_40);
  if (iVar1 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = std::operator<<((ostream *)local_1c8,"Error in ");
    poVar2 = std::operator<<(poVar2,"virtual void foxxll::ufs_file_base::lock()");
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,"fcntl(,F_SETLK,) path=");
    poVar2 = std::operator<<(poVar2,(string *)&this->filename_);
    poVar2 = std::operator<<(poVar2," fd=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->file_des_);
    poVar2 = std::operator<<(poVar2," : ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    this_00 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(this_00,&local_1e8);
    __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&lock_struct.l_pid);
  return;
}

Assistant:

void ufs_file_base::lock()
{
#if FOXXLL_WINDOWS || defined(__MINGW32__)
    // not yet implemented
#else
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);
    struct flock lock_struct;
    lock_struct.l_type = static_cast<short>(mode_ & RDONLY ? F_RDLCK : F_RDLCK | F_WRLCK);
    lock_struct.l_whence = SEEK_SET;
    lock_struct.l_start = 0;
    lock_struct.l_len = 0; // lock all bytes
    if ((::fcntl(file_des_, F_SETLK, &lock_struct)) < 0)
        FOXXLL_THROW_ERRNO(io_error, "fcntl(,F_SETLK,) path=" << filename_ << " fd=" << file_des_);
#endif
}